

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdPermute(char *pDsd)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int nVars;
  int pPerm [16];
  int aiStack_58 [18];
  
  cVar2 = *pDsd;
  if (cVar2 == '\0') {
    nVars = 1;
  }
  else {
    pcVar1 = pDsd + 1;
    uVar4 = 0;
    do {
      bVar3 = cVar2 + 0x9f;
      uVar5 = (uint)bVar3;
      if (bVar3 < uVar4) {
        uVar5 = uVar4;
      }
      if (0x19 < bVar3) {
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
    nVars = uVar4 + 1;
  }
  Dau_DsdGenRandPerm(aiStack_58,nVars);
  cVar2 = *pDsd;
  if (cVar2 != '\0') {
    pcVar1 = pDsd + 1;
    do {
      if (('`' < cVar2) && ((int)cVar2 < nVars + 0x61)) {
        pcVar1[-1] = (char)aiStack_58[(int)cVar2 - 0x61] + 'a';
      }
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void Dau_DsdPermute( char * pDsd )
{
    int pPerm[16];
    int nVars = Dau_DsdFindVarNum( pDsd );
    Dau_DsdGenRandPerm( pPerm, nVars );
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd < 'a' + nVars )
            *pDsd = 'a' + pPerm[*pDsd - 'a'];
}